

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O0

optional<Rgba> parseColor(string *str,size_type *n,uint16_t i)

{
  uint8_t r_00;
  uint8_t g_00;
  size_type sVar1;
  bool bVar2;
  optional<Rgba> oVar3;
  char *pcVar4;
  size_type sVar5;
  uchar *puVar6;
  Rgba local_31;
  _Optional_payload_base<unsigned_char> local_2c [2];
  _Optional_payload_base<unsigned_char> local_28 [2];
  optional<unsigned_char> b;
  optional<unsigned_char> g;
  optional<unsigned_char> r;
  uint16_t i_local;
  size_type *n_local;
  string *str_local;
  
  b = parseDec<unsigned_char>(str,n);
  bVar2 = std::optional::operator_cast_to_bool((optional *)&b);
  if (bVar2) {
    skipWhitespace<std::__cxx11::string>(str,n);
    sVar1 = *n;
    sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                      (str);
    if (sVar1 == sVar5) {
      pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(str);
      error("Failed to parse color #%u (\"%s\"): missing green component",(ulong)(i + 1),pcVar4);
      std::optional<Rgba>::optional((optional<Rgba> *)((long)&str_local + 3));
    }
    else {
      local_28[0] = (_Optional_payload_base<unsigned_char>)parseDec<unsigned_char>(str,n);
      bVar2 = std::optional::operator_cast_to_bool((optional *)local_28);
      if (bVar2) {
        skipWhitespace<std::__cxx11::string>(str,n);
        sVar1 = *n;
        sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                length(str);
        if (sVar1 == sVar5) {
          pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   c_str(str);
          error("Failed to parse color #%u (\"%s\"): missing blue component",(ulong)(i + 1),pcVar4);
          std::optional<Rgba>::optional((optional<Rgba> *)((long)&str_local + 3));
        }
        else {
          local_2c[0] = (_Optional_payload_base<unsigned_char>)parseDec<unsigned_char>(str,n);
          bVar2 = std::optional::operator_cast_to_bool((optional *)local_2c);
          if (bVar2) {
            puVar6 = std::optional<unsigned_char>::operator*(&b);
            r_00 = *puVar6;
            puVar6 = std::optional<unsigned_char>::operator*((optional<unsigned_char> *)local_28);
            g_00 = *puVar6;
            puVar6 = std::optional<unsigned_char>::operator*((optional<unsigned_char> *)local_2c);
            Rgba::Rgba(&local_31,r_00,g_00,*puVar6,0xff);
            std::optional<Rgba>::optional<Rgba,_true>
                      ((optional<Rgba> *)((long)&str_local + 3),&local_31);
          }
          else {
            pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::c_str(str);
            error("Failed to parse color #%u (\"%s\"): invalid blue component",(ulong)(i + 1),pcVar4
                 );
            std::optional<Rgba>::optional((optional<Rgba> *)((long)&str_local + 3));
          }
        }
      }
      else {
        pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 c_str(str);
        error("Failed to parse color #%u (\"%s\"): invalid green component",(ulong)(i + 1),pcVar4);
        std::optional<Rgba>::optional((optional<Rgba> *)((long)&str_local + 3));
      }
    }
  }
  else {
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (str);
    error("Failed to parse color #%u (\"%s\"): invalid red component",(ulong)(i + 1),pcVar4);
    std::optional<Rgba>::optional((optional<Rgba> *)((long)&str_local + 3));
  }
  oVar3.super__Optional_base<Rgba,_true,_true>._M_payload.super__Optional_payload_base<Rgba>.
  _M_engaged = (bool)str_local._7_1_;
  oVar3.super__Optional_base<Rgba,_true,_true>._M_payload.super__Optional_payload_base<Rgba>.
  _M_payload = str_local._3_4_;
  return (optional<Rgba>)
         oVar3.super__Optional_base<Rgba,_true,_true>._M_payload.super__Optional_payload_base<Rgba>;
}

Assistant:

static std::optional<Rgba> parseColor(std::string const &str, std::string::size_type &n,
                                      uint16_t i) {
	std::optional<uint8_t> r = parseDec<uint8_t>(str, n);
	if (!r) {
		error("Failed to parse color #%" PRIu16 " (\"%s\"): invalid red component", i + 1,
		      str.c_str());
		return std::nullopt;
	}
	skipWhitespace(str, n);
	if (n == str.length()) {
		error("Failed to parse color #%" PRIu16 " (\"%s\"): missing green component", i + 1,
		      str.c_str());
		return std::nullopt;
	}
	std::optional<uint8_t> g = parseDec<uint8_t>(str, n);
	if (!g) {
		error("Failed to parse color #%" PRIu16 " (\"%s\"): invalid green component", i + 1,
		      str.c_str());
		return std::nullopt;
	}
	skipWhitespace(str, n);
	if (n == str.length()) {
		error("Failed to parse color #%" PRIu16 " (\"%s\"): missing blue component", i + 1,
		      str.c_str());
		return std::nullopt;
	}
	std::optional<uint8_t> b = parseDec<uint8_t>(str, n);
	if (!b) {
		error("Failed to parse color #%" PRIu16 " (\"%s\"): invalid blue component", i + 1,
		      str.c_str());
		return std::nullopt;
	}

	return std::optional<Rgba>{Rgba(*r, *g, *b, 0xFF)};
}